

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncReadAscii(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  int64_t iVar1;
  bool bVar2;
  char cVar3;
  uintmax_t uVar4;
  Identifier *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t start;
  StringLiteral *local_6e8;
  int64_t length;
  StringLiteral *fileName;
  size_t bytesToRead;
  string result;
  string local_690;
  path fullName;
  error_code error;
  ifstream file;
  char buffer [1024];
  
  bVar2 = getExpFuncParameter(parameters,0,&fileName,funcName,false);
  if (!bVar2) {
LAB_0012b266:
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
    return __return_storage_ptr__;
  }
  start = 0;
  bVar2 = getExpFuncParameter(parameters,1,&start,funcName,true);
  if (!bVar2) goto LAB_0012b266;
  length = 0;
  bVar2 = getExpFuncParameter(parameters,2,&length,funcName,true);
  if (!bVar2) goto LAB_0012b266;
  ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
            ((path *)buffer,(filesystem *)fileName,source);
  getFullPathName(&fullName,(path *)buffer);
  ghc::filesystem::path::~path((path *)buffer);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  uVar4 = ghc::filesystem::file_size(&fullName,&error);
  iVar1 = start;
  lVar8 = length;
  if ((long)uVar4 < start + length) {
    lVar8 = uVar4 - start;
  }
  if (length == 0) {
    lVar8 = uVar4 - start;
  }
  args = (Identifier *)length;
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            (&file,&fullName,_S_in|_S_bin);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    Logger::queueError<StringLiteral>((Logger *)0x1,0x1765bd,(char *)fileName,(StringLiteral *)args)
    ;
  }
  else {
    std::istream::seekg(&file,iVar1,0);
    if (((&file.super_basic_ifstream<char,_std::char_traits<char>_>.
           super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 7) ==
        0) {
      local_6e8 = fileName;
      result._M_dataplus._M_p = (pointer)&result.field_2;
      result._M_string_length = 0;
      result.field_2._M_local_buf[0] = '\0';
      bVar2 = false;
      for (lVar7 = 0; (!bVar2 && (sVar5 = lVar8 - lVar7, sVar5 != 0 && lVar7 <= lVar8));
          lVar7 = lVar7 + 0x400) {
        if (0x3ff < (long)sVar5) {
          sVar5 = 0x400;
        }
        bytesToRead = sVar5;
        std::istream::read((char *)&file,(long)buffer);
        if (((&file.super_basic_ifstream<char,_std::char_traits<char>_>.
               super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
             [(long)file.super_basic_ifstream<char,_std::char_traits<char>_>.
                    super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5)
            != 0) {
          Logger::queueError<unsigned_long,StringLiteral>
                    (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",&bytesToRead,
                     local_6e8);
LAB_0012b39d:
          (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
          (__return_storage_ptr__->strValue)._value._M_string_length = 0;
          (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
          __return_storage_ptr__->type = Invalid;
          (__return_storage_ptr__->field_1).intValue = 0;
          goto LAB_0012b3b6;
        }
        for (lVar6 = 0;
            bVar2 = lVar6 < file.super_basic_ifstream<char,_std::char_traits<char>_>.
                            super_basic_istream<char,_std::char_traits<char>_>._M_gcount,
            lVar6 < file.super_basic_ifstream<char,_std::char_traits<char>_>.
                    super_basic_istream<char,_std::char_traits<char>_>._M_gcount; lVar6 = lVar6 + 1)
        {
          cVar3 = buffer[lVar6];
          args = (Identifier *)CONCAT71((int7)((ulong)args >> 8),cVar3);
          if (cVar3 == '\0') break;
          if (cVar3 < ' ') {
            Logger::printError<Identifier>((Logger *)0x0,0x17661e,(char *)funcName,args);
            goto LAB_0012b39d;
          }
          std::__cxx11::string::push_back((char)&result);
        }
      }
      std::__cxx11::string::string((string *)&local_690,(string *)&result);
      StringLiteral::StringLiteral((StringLiteral *)&bytesToRead,&local_690);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,(StringLiteral *)&bytesToRead);
      std::__cxx11::string::~string((string *)&bytesToRead);
      std::__cxx11::string::~string((string *)&local_690);
LAB_0012b3b6:
      std::__cxx11::string::~string((string *)&result);
      goto LAB_0012b2bf;
    }
    Logger::queueError<long,StringLiteral>(Error,"Invalid offset 0x%08X of %s",&start,fileName);
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
LAB_0012b2bf:
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&file);
  ghc::filesystem::path::~path(&fullName);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncReadAscii(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t start;
	int64_t length;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,start,0);
	GET_OPTIONAL_PARAM(parameters,2,length,0);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	int64_t totalSize = static_cast<int64_t>(fs::file_size(fullName, error));

	if (length == 0 || start+length > totalSize)
		length = totalSize-start;

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s", *fileName);
		return ExpressionValue();
	}

	file.seekg(start);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", start, *fileName);
		return ExpressionValue();
	}

	char buffer[1024];
	bool stringTerminated = false;
	std::string result;

	for (int64_t progress = 0; !stringTerminated && progress < length; progress += (int64_t) sizeof(buffer))
	{
		auto bytesToRead = (size_t) std::min((int64_t) sizeof(buffer), length - progress);

		file.read(buffer, bytesToRead);
		if (file.fail())
		{
			Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", bytesToRead, *fileName);
			return ExpressionValue();
		}

		for (std::streamsize i = 0; i < file.gcount(); i++)
		{
			if (buffer[i] == 0x00)
			{
				stringTerminated = true;
				break;
			}

			if (buffer[i] < 0x20)
			{
				Logger::printError(Logger::Warning, "%s: Non-ASCII character", funcName);
				return ExpressionValue();
			}

			result += buffer[i];
		}
	}

	return ExpressionValue(result);
}